

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBase.cpp
# Opt level: O3

void __thiscall
glcts::DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendFuncSeparate
          (BlendMaskStateMachine *this,GLenum src_rgb,GLenum dst_rgb,GLenum src_a,GLenum dst_a)

{
  pointer pBVar1;
  GLenum *pGVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  
  (*this->gl->blendFuncSeparate)(src_rgb,dst_rgb,src_a,dst_a);
  pBVar1 = (this->state).
           super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->state).
                super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1;
  if (lVar3 != 0) {
    pGVar2 = &pBVar1->func_dst_a;
    uVar4 = 1;
    do {
      pGVar2[-3] = src_rgb;
      pGVar2[-2] = src_a;
      pGVar2[-1] = dst_rgb;
      *pGVar2 = dst_a;
      uVar5 = (ulong)uVar4;
      pGVar2 = pGVar2 + 8;
      uVar4 = uVar4 + 1;
    } while (uVar5 < (ulong)(lVar3 >> 5));
  }
  return;
}

Assistant:

void DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendFuncSeparate(glw::GLenum src_rgb, glw::GLenum dst_rgb,
																		 glw::GLenum src_a, glw::GLenum dst_a)
{
	// all draw buffers
	gl.blendFuncSeparate(src_rgb, dst_rgb, src_a, dst_a);
	for (unsigned int i = 0; i < state.size(); ++i)
	{
		state[i].func_src_rgb = src_rgb;
		state[i].func_src_a   = src_a;
		state[i].func_dst_rgb = dst_rgb;
		state[i].func_dst_a   = dst_a;
	}
}